

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_stress_memory(_Bool copy_on_write)

{
  _Bool _Var1;
  int iVar2;
  roaring_bitmap_t *r;
  size_t sVar3;
  char *buf;
  size_t a;
  roaring_bitmap_t *r2;
  size_t i;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    r = roaring_bitmap_create();
    (r->high_low_container).flags = ((r->high_low_container).flags & 0xfe) + copy_on_write;
    _assert_true((unsigned_long)r,"r1",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x2bd);
    lVar5 = 1000000;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      iVar2 = rand();
      roaring_bitmap_add(r,iVar2 % 100000000);
    }
    roaring_bitmap_run_optimize(r);
    sVar3 = roaring_bitmap_portable_size_in_bytes(r);
    buf = (char *)malloc(sVar3 & 0xffffffff);
    a = roaring_bitmap_portable_serialize(r,buf);
    _assert_int_equal(a,sVar3 & 0xffffffff,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                      ,0x2c7);
    r2 = roaring_bitmap_portable_deserialize(buf);
    _Var1 = roaring_bitmap_equals(r,r2);
    _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, t)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x2ca);
    roaring_bitmap_free(r2);
    free(buf);
    roaring_bitmap_free(r);
  }
  return;
}

Assistant:

void test_stress_memory(bool copy_on_write) {
    for (size_t i = 0; i < 5; i++) {
        roaring_bitmap_t *r1 = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(r1, copy_on_write);
        assert_non_null(r1);
        for (size_t k = 0; k < 1000000; k++) {
            uint32_t j = rand() % (100000000);
            roaring_bitmap_add(r1, j);
        }
        roaring_bitmap_run_optimize(r1);
        uint32_t compact_size = roaring_bitmap_portable_size_in_bytes(r1);
        char *serializedbytes = (char *)malloc(compact_size);
        size_t actualsize =
            roaring_bitmap_portable_serialize(r1, serializedbytes);
        assert_int_equal(actualsize, compact_size);
        roaring_bitmap_t *t =
            roaring_bitmap_portable_deserialize(serializedbytes);
        assert_true(roaring_bitmap_equals(r1, t));
        roaring_bitmap_free(t);
        free(serializedbytes);
        roaring_bitmap_free(r1);
    }
}